

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O2

int raplcap_msr_pd_set_zone_clamped
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,int clamped)

{
  int iVar1;
  int iVar2;
  raplcap_msr *ctx;
  off_t msr;
  int clamped_local;
  uint64_t msrval;
  
  clamped_local = clamped;
  ctx = get_state(rc,pkg,die);
  msr = zone_to_msr_offset(zone,ZONE_OFFSETS_PL);
  iVar2 = -1;
  if (-1 < msr && ctx != (raplcap_msr *)0x0) {
    iVar1 = msr_sys_read(ctx->sys,&msrval,pkg,die,msr);
    if (iVar1 == 0) {
      msrval = msr_set_zone_clamped(&ctx->ctx,zone,msrval,&clamped_local,&clamped_local);
      iVar2 = msr_sys_write(ctx->sys,msrval,pkg,die,msr);
    }
  }
  return iVar2;
}

Assistant:

int raplcap_msr_pd_set_zone_clamped(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone, int clamped) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_msr_pd_set_zone_clamped: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msrval = msr_set_zone_clamped(&state->ctx, zone, msrval, &clamped, &clamped);
  return msr_sys_write(state->sys, msrval, pkg, die, msr);
}